

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_decompress1X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  undefined1 *puVar1;
  DTableDesc DVar2;
  uint uVar3;
  BIT_DStream_status BVar4;
  uint uVar5;
  undefined1 *puVar6;
  size_t sVar7;
  int bmi2_local;
  HUF_DTable *DTable_local;
  size_t cSrcSize_local;
  void *cSrc_local;
  size_t dstSize_local;
  void *dst_local;
  size_t _var_err__;
  U32 dtLog;
  DTableDesc dtd;
  BIT_DStream_t bitD;
  HUF_DEltX1 *dt;
  void *dtPtr;
  BYTE *oend;
  BYTE *op;
  size_t local_190;
  BYTE *pStart;
  undefined1 *local_160;
  BYTE c;
  size_t val;
  BYTE c_2;
  size_t val_2;
  BYTE c_3;
  size_t val_3;
  BYTE c_1;
  size_t val_1;
  BYTE c_4;
  size_t val_4;
  BYTE c_5;
  size_t val_5;
  
  puVar6 = (undefined1 *)((long)dst + dstSize);
  DVar2 = HUF_getDTableDesc(DTable);
  uVar5 = (uint)DVar2 >> 0x10 & 0xff;
  local_190 = BIT_initDStream((BIT_DStream_t *)&dtLog,cSrc,cSrcSize);
  uVar3 = ERR_isError(local_190);
  if (uVar3 == 0) {
    local_160 = (undefined1 *)dst;
    while (BVar4 = BIT_reloadDStream((BIT_DStream_t *)&dtLog),
          BVar4 == BIT_DStream_unfinished && local_160 < puVar6 + -3) {
      uVar3 = MEM_64bits();
      if (uVar3 != 0) {
        sVar7 = BIT_lookBitsFast((BIT_DStream_t *)&dtLog,uVar5);
        *local_160 = *(undefined1 *)((long)DTable + sVar7 * 2 + 4);
        local_160 = local_160 + 1;
      }
      MEM_64bits();
      sVar7 = BIT_lookBitsFast((BIT_DStream_t *)&dtLog,uVar5);
      *local_160 = *(undefined1 *)((long)DTable + sVar7 * 2 + 4);
      uVar3 = MEM_64bits();
      puVar1 = local_160 + 1;
      if (uVar3 != 0) {
        sVar7 = BIT_lookBitsFast((BIT_DStream_t *)&dtLog,uVar5);
        local_160[1] = *(undefined1 *)((long)DTable + sVar7 * 2 + 4);
        puVar1 = local_160 + 2;
      }
      local_160 = puVar1;
      sVar7 = BIT_lookBitsFast((BIT_DStream_t *)&dtLog,uVar5);
      *local_160 = *(undefined1 *)((long)DTable + sVar7 * 2 + 4);
      local_160 = local_160 + 1;
    }
    uVar3 = MEM_32bits();
    if (uVar3 != 0) {
      while (BVar4 = BIT_reloadDStream((BIT_DStream_t *)&dtLog),
            BVar4 == BIT_DStream_unfinished && local_160 < puVar6) {
        sVar7 = BIT_lookBitsFast((BIT_DStream_t *)&dtLog,uVar5);
        *local_160 = *(undefined1 *)((long)DTable + sVar7 * 2 + 4);
        local_160 = local_160 + 1;
      }
    }
    while (local_160 < puVar6) {
      sVar7 = BIT_lookBitsFast((BIT_DStream_t *)&dtLog,uVar5);
      *local_160 = *(undefined1 *)((long)DTable + sVar7 * 2 + 4);
      local_160 = local_160 + 1;
    }
    uVar5 = BIT_endOfDStream((BIT_DStream_t *)&dtLog);
    local_190 = dstSize;
    if (uVar5 == 0) {
      local_190 = 0xffffffffffffffec;
    }
  }
  return local_190;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)
HUF_DGEN(HUF_decompress4X1_usingDTable_internal)



size_t HUF_decompress1X1_usingDTable(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    if (dtd.tableType != 0) return ERROR(GENERIC);
    return HUF_decompress1X1_usingDTable_internal(dst, dstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
}